

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O1

void __thiscall
helix::nasdaq::itch50_handler::process_msg(itch50_handler *this,itch50_order_replace *m)

{
  order_book *this_00;
  uint uVar1;
  uint uVar2;
  order order;
  undefined1 auVar3 [24];
  side_type sVar4;
  undefined8 uVar5;
  __hash_code __code;
  _Hash_node_base *p_Var6;
  ulong uVar7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  ulong uVar10;
  _Hash_node_base *p_Var11;
  undefined7 uStack_77;
  event local_68;
  
  p_Var6 = (_Hash_node_base *)(ulong)m->StockLocate;
  uVar10 = (this->order_book_id_map)._M_h._M_bucket_count;
  uVar7 = (ulong)p_Var6 % uVar10;
  p_Var8 = (this->order_book_id_map)._M_h._M_buckets[uVar7 & 0xffffffff];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var11 = p_Var8->_M_nxt, p_Var9 = p_Var8, p_Var8->_M_nxt[1]._M_nxt != p_Var6)) {
    while (p_Var8 = p_Var11, p_Var11 = p_Var8->_M_nxt, p_Var11 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)p_Var11[1]._M_nxt % uVar10 != uVar7) ||
         (p_Var9 = p_Var8, p_Var11[1]._M_nxt == p_Var6)) goto LAB_0011575c;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_0011575c:
  if (p_Var9 == (__node_base_ptr)0x0) {
    p_Var6 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var6 = p_Var9->_M_nxt;
  }
  if (p_Var6 != (_Hash_node_base *)0x0) {
    this_00 = (order_book *)(p_Var6 + 2);
    sVar4 = order_book::side(this_00,m->OriginalOrderReferenceNumber);
    uVar1 = m->Price;
    uVar2 = m->Shares;
    uVar10 = (ulong)*(ushort *)&m->field_0x9 << 0x20;
    uVar7 = (ulong)*(uint6 *)&m->field_0x5;
    p_Var11 = (_Hash_node_base *)
              (((uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28 |
               uVar7 << 0x38) >> 0x10);
    order._33_7_ = uStack_77;
    order.side = sVar4;
    auVar3 = ZEXT1224(CONCAT48(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                               uVar1 << 0x18,m->NewOrderReferenceNumber)) << 0x40;
    order.quantity._0_4_ =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    order.level = (price_level *)auVar3._0_8_;
    order.id = auVar3._8_8_;
    order.price = auVar3._16_8_;
    order.quantity._4_4_ = 0;
    order.timestamp = (uint64_t)p_Var11;
    order_book::replace(this_00,m->OriginalOrderReferenceNumber,order);
    p_Var6[6]._M_nxt = p_Var11;
    make_ob_event(&local_68,(string *)this_00,(uint64_t)p_Var11,this_00,0);
    if ((this->_process_event).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar5 = std::__throw_bad_function_call();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._symbol._M_dataplus._M_p != &local_68._symbol.field_2) {
        operator_delete(local_68._symbol._M_dataplus._M_p,
                        local_68._symbol.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar5);
    }
    (*(this->_process_event)._M_invoker)((_Any_data *)this,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._symbol._M_dataplus._M_p != &local_68._symbol.field_2) {
      operator_delete(local_68._symbol._M_dataplus._M_p,
                      local_68._symbol.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void itch50_handler::process_msg(const itch50_order_replace* m)
{
    auto it = order_book_id_map.find(m->StockLocate);
    if (it != order_book_id_map.end()) {
        auto& ob = it->second;
        auto side = ob.side(m->OriginalOrderReferenceNumber);
        uint64_t order_id = m->NewOrderReferenceNumber;
        uint64_t price    = be32toh(m->Price);
        uint32_t quantity = be32toh(m->Shares);
        uint64_t timestamp = itch50_timestamp(m->Timestamp);
        order o{order_id, price, quantity, side, timestamp};
        ob.replace(m->OriginalOrderReferenceNumber, std::move(o));
        ob.set_timestamp(timestamp);
        _process_event(make_ob_event(ob.symbol(), timestamp, &ob));
    }
}